

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O3

int Abc_NtkRetimeFinalizeLatches(Abc_Ntk_t *pNtk,st__table *tLatches,int nIdMaxStart)

{
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *__ptr_00;
  Vec_Ptr_t *__ptr_01;
  void *pvVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pObj;
  char *pcVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  int Index;
  ulong local_88;
  Abc_Obj_t *local_60;
  int local_44;
  ulong local_40;
  Abc_Obj_t *local_38;
  
  __ptr = pNtk->vCis;
  uVar13 = 0;
  pNtk->vCis = (Vec_Ptr_t *)0x0;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  __ptr_00 = pNtk->vCos;
  pNtk->vCos = (Vec_Ptr_t *)0x0;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar7->pArray = ppvVar6;
  __ptr_01 = pNtk->vBoxes;
  pNtk->vBoxes = (Vec_Ptr_t *)0x0;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar8->pArray = ppvVar6;
  iVar3 = __ptr->nSize;
  iVar4 = tLatches->num_entries;
  local_88 = 100;
  uVar16 = 100;
  uVar22 = 0;
  if (iVar4 < iVar3) {
    uVar16 = 100;
    uVar11 = 0;
    do {
      if ((long)iVar3 <= (long)uVar11) goto LAB_0045b015;
      pvVar1 = __ptr->pArray[uVar11];
      iVar3 = (int)uVar16;
      if ((int)uVar11 == iVar3) {
        if (iVar3 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = 0x10;
          uVar16 = 0x10;
        }
        else {
          uVar16 = (ulong)(uint)(iVar3 * 2);
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(uVar16 * 8);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,uVar16 * 8);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar3 * 2;
        }
      }
      else {
        ppvVar6 = pVVar5->pArray;
      }
      uVar22 = uVar11 + 1;
      pVVar5->nSize = (int)uVar22;
      ppvVar6[uVar11] = pvVar1;
      iVar3 = __ptr->nSize;
      iVar4 = tLatches->num_entries;
      uVar11 = uVar22;
    } while ((long)uVar22 < (long)(iVar3 - iVar4));
  }
  iVar3 = __ptr_00->nSize;
  if (iVar4 < iVar3) {
    local_88 = 100;
    uVar11 = 0;
    do {
      if ((long)iVar3 <= (long)uVar11) goto LAB_0045b015;
      pvVar1 = __ptr_00->pArray[uVar11];
      iVar3 = (int)local_88;
      if ((int)uVar11 == iVar3) {
        if (iVar3 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
          }
          pVVar7->pArray = ppvVar6;
          pVVar7->nCap = 0x10;
          local_88 = 0x10;
        }
        else {
          local_88 = (ulong)(uint)(iVar3 * 2);
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(local_88 * 8);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar7->pArray,local_88 * 8);
          }
          pVVar7->pArray = ppvVar6;
          pVVar7->nCap = iVar3 * 2;
        }
      }
      else {
        ppvVar6 = pVVar7->pArray;
      }
      uVar13 = uVar11 + 1;
      pVVar7->nSize = (int)uVar13;
      ppvVar6[uVar11] = pvVar1;
      iVar3 = __ptr_00->nSize;
      iVar4 = tLatches->num_entries;
      uVar11 = uVar13;
    } while ((long)uVar13 < (long)(iVar3 - iVar4));
  }
  uVar11 = (ulong)(uint)__ptr_01->nSize;
  if (iVar4 < __ptr_01->nSize) {
    uVar17 = 100;
    uVar19 = 0;
    do {
      if ((long)(int)uVar11 <= (long)uVar19) goto LAB_0045b015;
      pvVar1 = __ptr_01->pArray[uVar19];
      iVar3 = (int)uVar17;
      if ((int)uVar19 == iVar3) {
        if (iVar3 < 0x10) {
          if (pVVar8->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar8->pArray,0x80);
          }
          pVVar8->pArray = ppvVar6;
          pVVar8->nCap = 0x10;
          uVar17 = 0x10;
        }
        else {
          uVar17 = (ulong)(uint)(iVar3 * 2);
          if (pVVar8->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(uVar17 * 8);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar8->pArray,uVar17 * 8);
          }
          pVVar8->pArray = ppvVar6;
          pVVar8->nCap = iVar3 * 2;
        }
      }
      else {
        ppvVar6 = pVVar8->pArray;
      }
      uVar20 = uVar19 + 1;
      pVVar8->nSize = (int)uVar20;
      ppvVar6[uVar19] = pvVar1;
      uVar11 = (ulong)__ptr_01->nSize;
      uVar19 = uVar20;
    } while ((long)uVar20 < (long)(uVar11 - (long)tLatches->num_entries));
  }
  else {
    uVar20 = 0;
    uVar17 = 100;
  }
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar10->pArray[lVar14];
      uVar21 = (uint)uVar22;
      iVar3 = (int)uVar13;
      if ((pAVar2 == (Abc_Obj_t *)0x0) || ((*(uint *)&pAVar2->field_0x14 & 0xf) != 8)) {
        uVar13 = uVar13 & 0xffffffff;
      }
      else {
        local_40 = uVar20;
        if ((uint)pAVar2->Id < (uint)nIdMaxStart) {
          iVar4 = st__lookup_int(tLatches,(char *)pAVar2,&local_44);
          if (iVar4 == 0) {
            puts("Abc_NtkRetimeFinalizeLatches(): Internal error.");
            return 0;
          }
          iVar4 = tLatches->num_entries;
          uVar12 = (__ptr_01->nSize - iVar4) + local_44;
          if (((int)uVar12 < 0) || (__ptr_01->nSize <= (int)uVar12)) {
LAB_0045b015:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (pAVar2 != (Abc_Obj_t *)__ptr_01->pArray[uVar12]) {
            __assert_fail("pLatch == Vec_PtrEntry(vBoxesOld, Vec_PtrSize(vBoxesOld) - st__count(tLatches) + Index)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retIncrem.c"
                          ,0xb8,"int Abc_NtkRetimeFinalizeLatches(Abc_Ntk_t *, st__table *, int)");
          }
          uVar12 = (__ptr_00->nSize - iVar4) + local_44;
          if (((int)uVar12 < 0) || (__ptr_00->nSize <= (int)uVar12)) goto LAB_0045b015;
          uVar15 = (__ptr->nSize - iVar4) + local_44;
          if (((int)uVar15 < 0) || (__ptr->nSize <= (int)uVar15)) goto LAB_0045b015;
          pObj = (Abc_Obj_t *)__ptr_00->pArray[uVar12];
          local_60 = (Abc_Obj_t *)__ptr->pArray[uVar15];
        }
        else {
          pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
          local_60 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
          pcVar9 = Abc_ObjName(pAVar2);
          Abc_ObjAssignName(local_60,pcVar9,"_out");
          pcVar9 = Abc_ObjName(pAVar2);
          Abc_ObjAssignName(pObj,pcVar9,"_in");
        }
        Abc_ObjAddFanin(pObj,(Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
        Abc_ObjPatchFanin(pAVar2,(Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]
                          ,pObj);
        if (0 < (pAVar2->vFanouts).nSize) {
          Abc_ObjTransferFanout(pAVar2,local_60);
        }
        Abc_ObjAddFanin(local_60,pAVar2);
        uVar22 = local_40;
        uVar12 = (uint)uVar16;
        local_38 = pObj;
        if (uVar21 == uVar12) {
          if ((int)uVar12 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nCap = 0x10;
            uVar16 = 0x10;
          }
          else {
            uVar16 = (ulong)(uVar12 * 2);
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(uVar16 * 8);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,uVar16 * 8);
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nCap = uVar12 * 2;
          }
        }
        else {
          ppvVar6 = pVVar5->pArray;
        }
        iVar18 = (int)uVar22;
        pVVar5->nSize = uVar21 + 1;
        ppvVar6[(int)uVar21] = local_60;
        iVar4 = (int)local_88;
        if (iVar3 == iVar4) {
          if (iVar4 < 0x10) {
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
            }
            pVVar7->pArray = ppvVar6;
            pVVar7->nCap = 0x10;
            local_88 = 0x10;
          }
          else {
            local_88 = (ulong)(uint)(iVar4 * 2);
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(local_88 * 8);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar7->pArray,local_88 * 8);
            }
            pVVar7->pArray = ppvVar6;
            pVVar7->nCap = iVar4 * 2;
          }
        }
        else {
          ppvVar6 = pVVar7->pArray;
        }
        uVar13 = (ulong)(iVar3 + 1U);
        pVVar7->nSize = iVar3 + 1U;
        ppvVar6[iVar3] = local_38;
        iVar3 = (int)uVar17;
        if (iVar18 == iVar3) {
          if (iVar3 < 0x10) {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar8->pArray,0x80);
            }
            pVVar8->pArray = ppvVar6;
            pVVar8->nCap = 0x10;
            uVar17 = 0x10;
          }
          else {
            uVar17 = (ulong)(uint)(iVar3 * 2);
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(uVar17 * 8);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar8->pArray,uVar17 * 8);
            }
            pVVar8->pArray = ppvVar6;
            pVVar8->nCap = iVar3 * 2;
          }
        }
        else {
          ppvVar6 = pVVar8->pArray;
        }
        pVVar8->nSize = iVar18 + 1U;
        ppvVar6[iVar18] = pAVar2;
        pVVar10 = pNtk->vObjs;
        uVar20 = (ulong)(iVar18 + 1U);
        uVar21 = uVar21 + 1;
      }
      lVar14 = lVar14 + 1;
      uVar22 = (ulong)uVar21;
    } while (lVar14 < pVVar10->nSize);
  }
  iVar3 = __ptr->nSize;
  if (0 < iVar3) {
    lVar14 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)__ptr->pArray[lVar14];
      if ((((*(uint *)&pAVar2->field_0x14 & 0xf) != 2) && ((pAVar2->vFanins).nSize == 0)) &&
         ((pAVar2->vFanouts).nSize == 0)) {
        Abc_NtkDeleteObj(pAVar2);
        iVar3 = __ptr->nSize;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar3);
  }
  iVar3 = __ptr_00->nSize;
  if (0 < iVar3) {
    lVar14 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)__ptr_00->pArray[lVar14];
      if ((((*(uint *)&pAVar2->field_0x14 & 0xf) != 3) && ((pAVar2->vFanins).nSize == 0)) &&
         ((pAVar2->vFanouts).nSize == 0)) {
        Abc_NtkDeleteObj(pAVar2);
        iVar3 = __ptr_00->nSize;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar3);
  }
  pNtk->vCis = pVVar5;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  pNtk->vCos = pVVar7;
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  pNtk->vBoxes = pVVar8;
  if (__ptr_01->pArray != (void **)0x0) {
    free(__ptr_01->pArray);
  }
  free(__ptr_01);
  return 1;
}

Assistant:

int Abc_NtkRetimeFinalizeLatches( Abc_Ntk_t * pNtk, st__table * tLatches, int nIdMaxStart )
{
    Vec_Ptr_t * vCisOld, * vCosOld, * vBoxesOld, * vCisNew, * vCosNew, * vBoxesNew;
    Abc_Obj_t * pObj, * pLatch, * pLatchIn, * pLatchOut;
    int i, Index;
    // create new arrays
    vCisOld   = pNtk->vCis;    pNtk->vCis   = NULL;  vCisNew   = Vec_PtrAlloc( 100 );
    vCosOld   = pNtk->vCos;    pNtk->vCos   = NULL;  vCosNew   = Vec_PtrAlloc( 100 );  
    vBoxesOld = pNtk->vBoxes;  pNtk->vBoxes = NULL;  vBoxesNew = Vec_PtrAlloc( 100 );
    // copy boxes and their CIs/COs
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vCisOld, pObj, i, Vec_PtrSize(vCisOld) - st__count(tLatches) )
        Vec_PtrPush( vCisNew, pObj );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vCosOld, pObj, i, Vec_PtrSize(vCosOld) - st__count(tLatches) )
        Vec_PtrPush( vCosNew, pObj );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vBoxesOld, pObj, i, Vec_PtrSize(vBoxesOld) - st__count(tLatches) )
        Vec_PtrPush( vBoxesNew, pObj );
    // go through the latches
    Abc_NtkForEachObj( pNtk, pLatch, i )
    {
        if ( !Abc_ObjIsLatch(pLatch) )
            continue;
        if ( Abc_ObjId(pLatch) >= (unsigned)nIdMaxStart )
        {
            // this is a new latch 
            pLatchIn  = Abc_NtkCreateBi(pNtk);
            pLatchOut = Abc_NtkCreateBo(pNtk);
            Abc_ObjAssignName( pLatchOut, Abc_ObjName(pLatch), "_out" );
            Abc_ObjAssignName( pLatchIn,  Abc_ObjName(pLatch), "_in" );
        }
        else
        {
            // this is an old latch 
            // get its number in the original order
            if ( ! st__lookup_int( tLatches, (char *)pLatch, &Index ) )
            {
                printf( "Abc_NtkRetimeFinalizeLatches(): Internal error.\n" );
                return 0;
            }
            assert( pLatch == Vec_PtrEntry(vBoxesOld, Vec_PtrSize(vBoxesOld) - st__count(tLatches) + Index) );
            // reconnect with the old LIs/LOs
            pLatchIn  = (Abc_Obj_t *)Vec_PtrEntry( vCosOld, Vec_PtrSize(vCosOld) - st__count(tLatches) + Index );
            pLatchOut = (Abc_Obj_t *)Vec_PtrEntry( vCisOld, Vec_PtrSize(vCisOld) - st__count(tLatches) + Index );
        }
        // connect
        Abc_ObjAddFanin( pLatchIn, Abc_ObjFanin0(pLatch) );
        Abc_ObjPatchFanin( pLatch, Abc_ObjFanin0(pLatch), pLatchIn );
        if ( Abc_ObjFanoutNum(pLatch) > 0 )
            Abc_ObjTransferFanout( pLatch, pLatchOut );
        Abc_ObjAddFanin( pLatchOut, pLatch );
        // add to the arrays
        Vec_PtrPush( vCisNew, pLatchOut );
        Vec_PtrPush( vCosNew, pLatchIn );
        Vec_PtrPush( vBoxesNew, pLatch );
    }
    // free useless Cis/Cos
    Vec_PtrForEachEntry( Abc_Obj_t *, vCisOld, pObj, i )
        if ( !Abc_ObjIsPi(pObj) && Abc_ObjFaninNum(pObj) == 0 && Abc_ObjFanoutNum(pObj) == 0 )
            Abc_NtkDeleteObj(pObj);
    Vec_PtrForEachEntry( Abc_Obj_t *, vCosOld, pObj, i )
        if ( !Abc_ObjIsPo(pObj) && Abc_ObjFaninNum(pObj) == 0 && Abc_ObjFanoutNum(pObj) == 0 )
            Abc_NtkDeleteObj(pObj);
    // set the new arrays
    pNtk->vCis   = vCisNew;   Vec_PtrFree( vCisOld );
    pNtk->vCos   = vCosNew;   Vec_PtrFree( vCosOld );
    pNtk->vBoxes = vBoxesNew; Vec_PtrFree( vBoxesOld );
    return 1;
}